

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall kj::PathPtr::endsWith(PathPtr *this,PathPtr suffix)

{
  size_t sVar1;
  size_t sVar2;
  size_t end;
  bool local_31;
  ArrayPtr<const_kj::String> local_30;
  PathPtr *local_20;
  PathPtr *this_local;
  PathPtr suffix_local;
  
  suffix_local.parts.ptr = (String *)suffix.parts.size_;
  this_local = (PathPtr *)suffix.parts.ptr;
  local_20 = this;
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  sVar2 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
  local_31 = false;
  if (sVar2 <= sVar1) {
    sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
    sVar2 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
    end = ArrayPtr<const_kj::String>::size(&this->parts);
    local_30 = ArrayPtr<const_kj::String>::slice(&this->parts,sVar1 - sVar2,end);
    local_31 = ArrayPtr<const_kj::String>::operator==
                         (&local_30,(ArrayPtr<const_kj::String> *)&this_local);
  }
  return local_31;
}

Assistant:

bool PathPtr::endsWith(PathPtr suffix) const {
  return parts.size() >= suffix.parts.size() &&
         parts.slice(parts.size() - suffix.parts.size(), parts.size()) == suffix.parts;
}